

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O2

string * llama_format_tensor_shape_abi_cxx11_
                   (string *__return_storage_ptr__,vector<long,_std::allocator<long>_> *ne)

{
  string *psVar1;
  const_reference pvVar2;
  size_t sVar3;
  size_t i;
  ulong __n;
  allocator<char> local_141;
  string *local_140;
  char buf [256];
  
  local_140 = __return_storage_ptr__;
  pvVar2 = std::vector<long,_std::allocator<long>_>::at(ne,0);
  snprintf(buf,0x100,"%5ld",*pvVar2);
  for (__n = 1; psVar1 = local_140,
      __n < (ulong)((long)(ne->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(ne->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
    sVar3 = strlen(buf);
    pvVar2 = std::vector<long,_std::allocator<long>_>::at(ne,__n);
    snprintf(buf + sVar3,0x100 - sVar3,", %5ld",*pvVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_140,buf,&local_141);
  return psVar1;
}

Assistant:

std::string llama_format_tensor_shape(const std::vector<int64_t> & ne) {
    char buf[256];
    snprintf(buf, sizeof(buf), "%5" PRId64, ne.at(0));
    for (size_t i = 1; i < ne.size(); i++) {
        snprintf(buf + strlen(buf), sizeof(buf) - strlen(buf), ", %5" PRId64, ne.at(i));
    }
    return buf;
}